

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
GGSock::Unserialize::operator()
          (Unserialize *this,vector<char,_std::allocator<char>_> *t,char *bufferData,
          size_t bufferSize,size_t *offset)

{
  bool bVar1;
  vector<char,_std::allocator<char>_> *in_RCX;
  vector<char,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  size_type in_R8;
  int i;
  int32_t n;
  bool res;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  int iVar3;
  undefined3 in_stack_ffffffffffffffd4;
  uint uVar4;
  undefined4 uVar5;
  
  uVar4 = CONCAT13(1,in_stack_ffffffffffffffd4);
  iVar3 = 0;
  bVar1 = operator()((Unserialize *)((ulong)uVar4 << 0x20),
                     (int32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI
                     ,in_stack_ffffffffffffffb8,(size_t *)0x13722d);
  uVar5 = CONCAT13(((byte)(uVar4 >> 0x18) & 1 & bVar1) != 0,(int3)uVar4);
  std::vector<char,_std::allocator<char>_>::resize(in_RCX,in_R8);
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    std::vector<char,_std::allocator<char>_>::operator[](in_RSI,(long)iVar2);
    bVar1 = operator()((Unserialize *)CONCAT44(uVar5,iVar3),
                       (char *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),in_RDI,
                       in_stack_ffffffffffffffb8,(size_t *)0x137295);
    uVar5 = CONCAT13(((byte)((uint)uVar5 >> 0x18) & 1 & bVar1) != 0,(int3)uVar5);
  }
  return true;
}

Assistant:

bool Unserialize::operator()(std::vector<T> & t, const char * bufferData, size_t bufferSize, size_t & offset) {
    bool res = true;

    int32_t n = 0;
    res &= operator()(n, bufferData, bufferSize, offset);

    t.resize(n);
    for (int i = 0; i < n; ++i) {
        res &= operator()(t[i], bufferData, bufferSize, offset);
    }

    return true;
}